

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_getf(kvtree *hash,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_6a8;
  undefined8 *local_680;
  undefined8 *local_650;
  undefined8 *local_628;
  uint *local_600;
  undefined8 *local_5d8;
  undefined8 *local_5b0;
  uint *local_588;
  undefined8 *local_560;
  uint local_538 [4];
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  uint local_47c;
  char local_478 [4];
  int size;
  char key [1024];
  int local_6c;
  uint local_68;
  int i;
  va_list args;
  char *pcStack_48;
  int count;
  char *token;
  char *search;
  char *format_copy;
  char *rest;
  kvtree *h;
  char *format_local;
  kvtree *hash_local;
  
  if (in_AL != '\0') {
    local_508 = in_XMM0_Qa;
    local_4f8 = in_XMM1_Qa;
    local_4e8 = in_XMM2_Qa;
    local_4d8 = in_XMM3_Qa;
    local_4c8 = in_XMM4_Qa;
    local_4b8 = in_XMM5_Qa;
    local_4a8 = in_XMM6_Qa;
    local_498 = in_XMM7_Qa;
  }
  if (hash == (kvtree *)0x0) {
    hash_local = (kvtree *)0x0;
  }
  else {
    format_copy = (char *)0x0;
    local_528 = in_RDX;
    local_520 = in_RCX;
    local_518 = in_R8;
    local_510 = in_R9;
    rest = (char *)hash;
    h = (kvtree *)format;
    format_local = (char *)hash;
    search = strdup(format);
    if (search == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x1ac);
    }
    pcStack_48 = strtok_r(search," ",&format_copy);
    args[0].reg_save_area._4_4_ = 0;
    while (pcStack_48 != (char *)0x0) {
      pcStack_48 = strtok_r((char *)0x0," ",&format_copy);
      args[0].reg_save_area._4_4_ = args[0].reg_save_area._4_4_ + 1;
    }
    kvtree_free(&search);
    search = strdup((char *)h);
    if (search == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x1c3);
    }
    args[0]._0_8_ = &stack0x00000008;
    i = 0x30;
    local_68 = 0x10;
    pcStack_48 = strtok_r(search," ",&format_copy);
    local_6c = 0;
    while( true ) {
      bVar2 = false;
      if ((local_6c < args[0].reg_save_area._4_4_) && (bVar2 = false, pcStack_48 != (char *)0x0)) {
        bVar2 = rest != (char *)0x0;
      }
      if (!bVar2) break;
      local_47c = 0;
      iVar1 = strcmp(pcStack_48,"%s");
      if (iVar1 == 0) {
        if (local_68 < 0x29) {
          local_560 = (undefined8 *)((long)local_538 + (long)(int)local_68);
          local_68 = local_68 + 8;
        }
        else {
          local_560 = (undefined8 *)args[0]._0_8_;
          args[0]._0_8_ = args[0]._0_8_ + 8;
        }
        local_47c = snprintf(local_478,0x400,pcStack_48,*local_560);
      }
      else {
        iVar1 = strcmp(pcStack_48,"%d");
        if (iVar1 == 0) {
          if (local_68 < 0x29) {
            local_588 = (uint *)((long)local_538 + (long)(int)local_68);
            local_68 = local_68 + 8;
          }
          else {
            local_588 = (uint *)args[0]._0_8_;
            args[0]._0_8_ = args[0]._0_8_ + 8;
          }
          local_47c = snprintf(local_478,0x400,pcStack_48,(ulong)*local_588);
        }
        else {
          iVar1 = strcmp(pcStack_48,"%lld");
          if (iVar1 == 0) {
            if (local_68 < 0x29) {
              local_5b0 = (undefined8 *)((long)local_538 + (long)(int)local_68);
              local_68 = local_68 + 8;
            }
            else {
              local_5b0 = (undefined8 *)args[0]._0_8_;
              args[0]._0_8_ = args[0]._0_8_ + 8;
            }
            local_47c = snprintf(local_478,0x400,pcStack_48,*local_5b0);
          }
          else {
            iVar1 = strcmp(pcStack_48,"%lu");
            if (iVar1 == 0) {
              if (local_68 < 0x29) {
                local_5d8 = (undefined8 *)((long)local_538 + (long)(int)local_68);
                local_68 = local_68 + 8;
              }
              else {
                local_5d8 = (undefined8 *)args[0]._0_8_;
                args[0]._0_8_ = args[0]._0_8_ + 8;
              }
              local_47c = snprintf(local_478,0x400,pcStack_48,*local_5d8);
            }
            else {
              iVar1 = strcmp(pcStack_48,"%#x");
              if (iVar1 == 0) {
                if (local_68 < 0x29) {
                  local_600 = (uint *)((long)local_538 + (long)(int)local_68);
                  local_68 = local_68 + 8;
                }
                else {
                  local_600 = (uint *)args[0]._0_8_;
                  args[0]._0_8_ = args[0]._0_8_ + 8;
                }
                local_47c = snprintf(local_478,0x400,pcStack_48,(ulong)*local_600);
              }
              else {
                iVar1 = strcmp(pcStack_48,"%#lx");
                if (iVar1 == 0) {
                  if (local_68 < 0x29) {
                    local_628 = (undefined8 *)((long)local_538 + (long)(int)local_68);
                    local_68 = local_68 + 8;
                  }
                  else {
                    local_628 = (undefined8 *)args[0]._0_8_;
                    args[0]._0_8_ = args[0]._0_8_ + 8;
                  }
                  local_47c = snprintf(local_478,0x400,pcStack_48,*local_628);
                }
                else {
                  iVar1 = strcmp(pcStack_48,"%llu");
                  if (iVar1 == 0) {
                    if (local_68 < 0x29) {
                      local_650 = (undefined8 *)((long)local_538 + (long)(int)local_68);
                      local_68 = local_68 + 8;
                    }
                    else {
                      local_650 = (undefined8 *)args[0]._0_8_;
                      args[0]._0_8_ = args[0]._0_8_ + 8;
                    }
                    local_47c = snprintf(local_478,0x400,pcStack_48,*local_650);
                  }
                  else {
                    iVar1 = strcmp(pcStack_48,"%f");
                    if (iVar1 == 0) {
                      if ((uint)i < 0xa1) {
                        local_680 = (undefined8 *)((long)local_538 + (long)i);
                        i = i + 0x10;
                      }
                      else {
                        local_680 = (undefined8 *)args[0]._0_8_;
                        args[0]._0_8_ = args[0]._0_8_ + 8;
                      }
                      local_47c = snprintf(local_478,0x400,pcStack_48,*local_680);
                    }
                    else {
                      iVar1 = strcmp(pcStack_48,"%p");
                      if (iVar1 == 0) {
                        if (local_68 < 0x29) {
                          local_6a8 = (undefined8 *)((long)local_538 + (long)(int)local_68);
                          local_68 = local_68 + 8;
                        }
                        else {
                          local_6a8 = (undefined8 *)args[0]._0_8_;
                          args[0]._0_8_ = args[0]._0_8_ + 8;
                        }
                        local_47c = snprintf(local_478,0x400,pcStack_48,*local_6a8);
                      }
                      else {
                        kvtree_abort(-1,"Unsupported hash key format \'%s\' @ %s:%d",pcStack_48,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                     ,0x1e6);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (0x3ff < local_47c) {
        kvtree_abort(-1,"Key buffer too small, have %lu need %d bytes @ %s:%d",0x400,
                     (ulong)local_47c,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                     ,0x1ed);
      }
      rest = (char *)kvtree_get((kvtree *)rest,local_478);
      pcStack_48 = strtok_r((char *)0x0," ",&format_copy);
      local_6c = local_6c + 1;
    }
    kvtree_free(&search);
    hash_local = (kvtree *)rest;
  }
  return hash_local;
}

Assistant:

kvtree* kvtree_getf(const kvtree* hash, const char* format, ...)
{
  /* check that we have a hash */
  if (hash == NULL) {
    return NULL;
  }

  const kvtree* h = hash;
  char* rest = NULL;

  /* make a copy of the format specifier, since strtok clobbers it */
  char* format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* we break up tokens by spaces */
  char* search = " ";
  char* token = NULL;

  /* count how many keys we have */
  token = strtok_r(format_copy, search, &rest);
  int count = 0;
  while (token != NULL) {
    token = strtok_r(NULL, search, &rest);
    count++;
  }

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* make a copy of the format specifier, since strtok clobbers it */
  format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* for each format specifier, convert the next key argument to a
   * string and look up the hash for that key */
  va_list args;
  va_start(args, format);
  token = strtok_r(format_copy, search, &rest);
  int i = 0;
  while (i < count && token != NULL && h != NULL) {
    /* interpret the format and convert the current key argument to
     * a string */
    char key[KVTREE_MAX_LINE];
    int size = 0;
    if (strcmp(token, "%s") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, char*));
    } else if (strcmp(token, "%d")  == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, int));
    } else if (strcmp(token, "%lld") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, long long));
    } else if (strcmp(token, "%lu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%#x") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned int));
    } else if (strcmp(token, "%#lx") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%llu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long long));
    } else if (strcmp(token, "%f") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, double));
    } else if (strcmp(token, "%p") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, void*));
    } else {
      kvtree_abort(-1, "Unsupported hash key format '%s' @ %s:%d",
        token, __FILE__, __LINE__
      );
    }

    /* check that we were able to fit the string into our buffer */
    if (size >= sizeof(key)) {
      kvtree_abort(-1, "Key buffer too small, have %lu need %d bytes @ %s:%d",
        sizeof(key), size, __FILE__, __LINE__
      );
    }

    /* get hash for this key */
    h = kvtree_get(h, key);

    /* get the next format string */
    token = strtok_r(NULL, search, &rest);
    i++;
  }
  va_end(args);

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* return the hash we found */
  return (kvtree*) h;
}